

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vwdll.cpp
# Opt level: O0

void VW_Finish_Passes(VW_HANDLE handle)

{
  vw *in_RDI;
  vw *pointer;
  
  if (1 < in_RDI->numpasses) {
    adjust_used_index(in_RDI);
    in_RDI->do_reset_source = true;
    VW::start_parser(in_RDI);
    LEARNER::generic_driver((vw *)0x1a51ac);
    VW::end_parser((vw *)0x1a51b6);
  }
  return;
}

Assistant:

VW_DLL_MEMBER void      VW_CALLING_CONV VW_Finish_Passes(VW_HANDLE handle)
{ vw * pointer = static_cast<vw*>(handle);
  if (pointer->numpasses > 1)
  { adjust_used_index(*pointer);
    pointer->do_reset_source = true;
    VW::start_parser(*pointer);
    LEARNER::generic_driver(*pointer);
    VW::end_parser(*pointer);
  }
}